

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

optional<bool> __thiscall
unodb::detail::olc_impl_helpers::
remove_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_impl_helpers *this,
          olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *inode,byte key_byte,basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k,
          olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *db_instance,read_critical_section *parent_critical_section,
          read_critical_section *node_critical_section,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          *node_in_parent,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          **child_in_parent,read_critical_section *child_critical_section,node_type *child_type,
          olc_node_ptr *child)

{
  long *plVar1;
  atomic<long> *paVar2;
  atomic<unsigned_long> *paVar3;
  long lVar4;
  undefined8 uVar5;
  long *plVar6;
  long lVar7;
  __int_type_conflict _Var8;
  __int_type_conflict _Var9;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar10;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar11;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar12;
  uint uVar13;
  write_guard wVar14;
  bool bVar15;
  ushort uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  pthread_t pVar20;
  ulong uVar21;
  undefined7 in_register_00000011;
  uintptr_t uVar22;
  db_type *db_instance_00;
  ushort uVar23;
  ulong __n;
  optimistic_lock *poVar24;
  undefined1 auVar25 [16];
  __atomic_base<unsigned_long> local_60;
  write_guard node_guard;
  id local_50;
  write_guard child_guard_1;
  write_guard local_40;
  write_guard node_guard_1;
  write_guard child_guard;
  
  db_instance_00 = k.field_0._8_8_;
  uVar21 = k.field_0._0_8_;
  auVar25[0] = SUB81(inode,0);
  auVar25[1] = auVar25[0];
  auVar25[2] = auVar25[0];
  auVar25[3] = auVar25[0];
  auVar25[4] = auVar25[0];
  auVar25[5] = auVar25[0];
  auVar25[6] = auVar25[0];
  auVar25[7] = auVar25[0];
  auVar25[8] = auVar25[0];
  auVar25[9] = auVar25[0];
  auVar25[10] = auVar25[0];
  auVar25[0xb] = auVar25[0];
  auVar25[0xc] = auVar25[0];
  auVar25[0xd] = auVar25[0];
  auVar25[0xe] = auVar25[0];
  auVar25[0xf] = auVar25[0];
  auVar25 = vpcmpeqb_avx(auVar25,*(undefined1 (*) [16])(this + 0x30));
  uVar17 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) &
           ~(-1 << ((byte)this[0x20] & 0x1f));
  if (uVar17 == 0) {
    plVar6 = (long *)(db_instance->root_pointer_lock).version.version.
                     super___atomic_base<unsigned_long>._M_i;
    lVar7 = (db_instance->root_pointer_lock).read_lock_count.super___atomic_base<long>._M_i;
    if (plVar6[1] < 1) {
LAB_001d84d8:
      __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
    }
    LOCK();
    plVar1 = plVar6 + 1;
    lVar4 = *plVar1;
    *plVar1 = *plVar1 + -1;
    UNLOCK();
    if (lVar7 == *plVar6) {
      if (lVar4 < 1) goto LAB_001d84f7;
      (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i = 0;
      poVar24 = parent_critical_section->lock;
      _Var8 = (parent_critical_section->version).version;
      if ((poVar24->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001d84d8;
      _Var9 = (poVar24->version).version.super___atomic_base<unsigned_long>._M_i;
      LOCK();
      paVar2 = &poVar24->read_lock_count;
      uVar22 = (paVar2->super___atomic_base<long>)._M_i;
      (paVar2->super___atomic_base<long>)._M_i = (paVar2->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      child_in_parent =
           (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> **)
           parent_critical_section;
      if (_Var8 == _Var9) {
LAB_001d8321:
        if ((long)uVar22 < 1) goto LAB_001d84f7;
        ((read_critical_section *)child_in_parent)->lock = (optimistic_lock *)0x0;
        uVar23 = 0x100;
        uVar16 = 0;
        goto LAB_001d8338;
      }
      if ((long)uVar22 < 1) goto LAB_001d84f7;
      parent_critical_section->lock = (optimistic_lock *)0x0;
    }
    else {
      if (lVar4 < 1) goto LAB_001d84f7;
      (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i = 0;
    }
  }
  else {
    uVar13 = 0;
    if (uVar17 != 0) {
      for (; (uVar17 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
      }
    }
    *(undefined8 *)child_type = *(undefined8 *)(this + (ulong)uVar13 * 8 + 0x40);
    child_guard_1.lock = &db_instance->root_pointer_lock;
    bVar15 = optimistic_lock::check
                       (parent_critical_section->lock,
                        (version_type)(parent_critical_section->version).version);
    if (bVar15) {
      optimistic_lock::try_read_lock((optimistic_lock *)&stack0xffffffffffffffa0);
      *child_in_parent =
           (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
           local_60._M_i;
      local_60._M_i = 0;
      child_in_parent[1] =
           (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
           node_guard.lock;
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)&stack0xffffffffffffffa0);
      if (*child_in_parent !=
          (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)0x0
         ) {
        uVar5 = *(undefined8 *)child_type;
        *(byte *)&child_critical_section->lock = (byte)uVar5 & 7;
        if ((uVar5 & (I256|I48)) == LEAF) {
          uVar19 = (ulong)*(uint *)((uVar5 & 0xfffffffffffffff8) + 0x18);
          __n = uVar21;
          if (uVar19 < uVar21) {
            __n = uVar19;
          }
          iVar18 = bcmp((void *)CONCAT71(in_register_00000011,key_byte),
                        (void *)((uVar5 & 0xfffffffffffffff8) + 0x20),__n);
          wVar14 = child_guard_1;
          if (iVar18 == 0 && uVar19 == uVar21) {
            if (this[0x20] == (olc_impl_helpers)0x5) {
              basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
              ::
              make_db_inode_unique_ptr<unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&>
                        ((basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
                          *)&stack0xffffffffffffffa0,db_instance_00,
                         (olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                          *)this);
              bVar15 = optimistic_lock::try_upgrade_to_write_lock
                                 ((optimistic_lock *)
                                  ((wVar14.lock)->version).version.
                                  super___atomic_base<unsigned_long>._M_i,
                                  (version_type)
                                  ((wVar14.lock)->read_lock_count).super___atomic_base<long>._M_i);
              node_guard_1.lock = (optimistic_lock *)0x0;
              if (bVar15) {
                node_guard_1.lock =
                     (optimistic_lock *)
                     ((wVar14.lock)->version).version.super___atomic_base<unsigned_long>._M_i;
              }
              ((wVar14.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
              if (node_guard_1.lock != (optimistic_lock *)0x0) {
                bVar15 = optimistic_lock::try_upgrade_to_write_lock
                                   (parent_critical_section->lock,
                                    (version_type)(parent_critical_section->version).version);
                local_40.lock = (optimistic_lock *)0x0;
                if (bVar15) {
                  local_40.lock = parent_critical_section->lock;
                }
                parent_critical_section->lock = (optimistic_lock *)0x0;
                if (local_40.lock != (optimistic_lock *)0x0) {
                  bVar15 = optimistic_lock::try_upgrade_to_write_lock
                                     ((optimistic_lock *)*child_in_parent,
                                      (version_type)child_in_parent[1]);
                  local_50._M_thread = 0;
                  if (bVar15) {
                    local_50._M_thread = (native_handle_type)*child_in_parent;
                  }
                  *child_in_parent =
                       (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                        *)0x0;
                  if ((in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                       *)local_50._M_thread !=
                      (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                       *)0x0) {
                    olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                    ::init((olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                            *)node_guard.lock,(EVP_PKEY_CTX *)db_instance_00);
                    wVar14 = node_guard;
                    node_guard.lock = (optimistic_lock *)0x0;
                    if (((ulong)wVar14.lock & 7) != 0) {
                      __assert_fail("(result & ptr_bit_mask) == uintptr",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                                    ,0x182,
                                    "static std::uintptr_t unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr(const Header *, unodb::node_type) [Header = unodb::detail::olc_node_header]"
                                   );
                    }
                    node_critical_section->lock = wVar14.lock | 1;
                    if (local_40.lock != (optimistic_lock *)0x0) {
                      __assert_fail("!node_guard.active()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                    ,0x644,
                                    "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = std::span<const std::byte>, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_16<std::span<const std::byte>, std::span<const std::byte>>]"
                                   );
                    }
                    if ((in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                         *)local_50._M_thread !=
                        (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                         *)0x0) {
                      __assert_fail("!child_guard.active()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                    ,0x645,
                                    "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = std::span<const std::byte>, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_16<std::span<const std::byte>, std::span<const std::byte>>]"
                                   );
                    }
                    (node_in_parent->value)._M_i.tagged_ptr = 0;
                    optimistic_lock::write_guard::~write_guard
                              ((write_guard *)&stack0xffffffffffffffb0);
                    optimistic_lock::write_guard::~write_guard(&local_40);
                    optimistic_lock::write_guard::~write_guard(&node_guard_1);
                    std::
                    unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                   *)&stack0xffffffffffffffa0);
                    LOCK();
                    paVar3 = (db_instance_00->shrinking_inode_counts)._M_elems + 1;
                    (paVar3->super___atomic_base<unsigned_long>)._M_i =
                         (paVar3->super___atomic_base<unsigned_long>)._M_i + 1;
                    UNLOCK();
                    goto LAB_001d80c1;
                  }
                  optimistic_lock::write_guard::~write_guard
                            ((write_guard *)&stack0xffffffffffffffb0);
                }
                optimistic_lock::write_guard::~write_guard(&local_40);
              }
              optimistic_lock::write_guard::~write_guard(&node_guard_1);
              std::
              unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
              ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             *)&stack0xffffffffffffffa0);
              goto LAB_001d84c0;
            }
            plVar6 = (long *)((child_guard_1.lock)->version).version.
                             super___atomic_base<unsigned_long>._M_i;
            lVar7 = ((child_guard_1.lock)->read_lock_count).super___atomic_base<long>._M_i;
            if (plVar6[1] < 1) goto LAB_001d84d8;
            LOCK();
            plVar1 = plVar6 + 1;
            lVar4 = *plVar1;
            *plVar1 = *plVar1 + -1;
            UNLOCK();
            wVar14 = child_guard_1;
            if (lVar7 == *plVar6) {
              if (lVar4 < 1) goto LAB_001d84f7;
              uVar23 = 0;
              ((child_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
              bVar15 = optimistic_lock::try_upgrade_to_write_lock
                                 (parent_critical_section->lock,
                                  (version_type)(parent_critical_section->version).version);
              local_60._M_i = 0;
              if (bVar15) {
                local_60._M_i = (__int_type_conflict)parent_critical_section->lock;
              }
              parent_critical_section->lock = (optimistic_lock *)0x0;
              if ((optimistic_lock *)local_60._M_i != (optimistic_lock *)0x0) {
                bVar15 = optimistic_lock::try_upgrade_to_write_lock
                                   ((optimistic_lock *)*child_in_parent,
                                    (version_type)child_in_parent[1]);
                uVar23 = 0;
                poVar24 = (optimistic_lock *)0x0;
                if (bVar15) {
                  poVar24 = (optimistic_lock *)*child_in_parent;
                }
                *child_in_parent =
                     (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                      *)0x0;
                node_guard_1.lock = poVar24;
                if (poVar24 != (optimistic_lock *)0x0) {
                  optimistic_lock::atomic_version_type::write_unlock_and_obsolete(&poVar24->version)
                  ;
                  pVar20 = pthread_self();
                  (poVar24->obsoleter_thread)._M_thread = pVar20;
                  node_guard_1.lock = (optimistic_lock *)0x0;
                  olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                  ::remove((olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                            *)this,(char *)((ulong)uVar13 & 0xff));
                  (node_in_parent->value)._M_i.tagged_ptr = 0;
                  uVar23 = 0x100;
                }
                optimistic_lock::write_guard::~write_guard(&node_guard_1);
              }
              optimistic_lock::write_guard::~write_guard((write_guard *)&stack0xffffffffffffffa0);
              goto LAB_001d8266;
            }
          }
          else {
            plVar6 = (long *)((child_guard_1.lock)->version).version.
                             super___atomic_base<unsigned_long>._M_i;
            lVar7 = ((child_guard_1.lock)->read_lock_count).super___atomic_base<long>._M_i;
            if (plVar6[1] < 1) goto LAB_001d84d8;
            LOCK();
            plVar1 = plVar6 + 1;
            lVar4 = *plVar1;
            *plVar1 = *plVar1 + -1;
            UNLOCK();
            wVar14 = child_guard_1;
            if (lVar7 == *plVar6) {
              if (lVar4 < 1) goto LAB_001d84f7;
              ((child_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
              poVar24 = parent_critical_section->lock;
              _Var8 = (parent_critical_section->version).version;
              if ((poVar24->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001d84d8;
              _Var9 = (poVar24->version).version.super___atomic_base<unsigned_long>._M_i;
              LOCK();
              paVar2 = &poVar24->read_lock_count;
              lVar4 = (paVar2->super___atomic_base<long>)._M_i;
              (paVar2->super___atomic_base<long>)._M_i =
                   (paVar2->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              wVar14.lock = (optimistic_lock *)parent_critical_section;
              if (_Var8 == _Var9) {
                if (lVar4 < 1) goto LAB_001d84f7;
                parent_critical_section->lock = (optimistic_lock *)0x0;
                piVar10 = *child_in_parent;
                piVar11 = child_in_parent[1];
                if ((long)piVar10[1].value._M_i.tagged_ptr < 1) goto LAB_001d84d8;
                piVar12 = (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                           *)(piVar10->value)._M_i.tagged_ptr;
                LOCK();
                piVar10 = piVar10 + 1;
                uVar22 = (piVar10->value)._M_i.tagged_ptr;
                (piVar10->value)._M_i.tagged_ptr = (piVar10->value)._M_i.tagged_ptr - 1;
                UNLOCK();
                if (piVar11 == piVar12) goto LAB_001d8321;
                if ((long)uVar22 < 1) goto LAB_001d84f7;
                *child_in_parent =
                     (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                      *)0x0;
                goto LAB_001d84c0;
              }
            }
          }
          parent_critical_section = (read_critical_section *)wVar14.lock;
          if (lVar4 < 1) {
LAB_001d84f7:
            __assert_fail("old_value > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                          ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
          }
          goto LAB_001d84b9;
        }
        (node_in_parent->value)._M_i.tagged_ptr = (uintptr_t)(this + (ulong)uVar13 * 8 + 0x40);
        plVar6 = (long *)((child_guard_1.lock)->version).version.super___atomic_base<unsigned_long>.
                         _M_i;
        lVar7 = ((child_guard_1.lock)->read_lock_count).super___atomic_base<long>._M_i;
        if (plVar6[1] < 1) goto LAB_001d84d8;
        LOCK();
        plVar1 = plVar6 + 1;
        lVar4 = *plVar1;
        *plVar1 = *plVar1 + -1;
        UNLOCK();
        if (lVar7 == *plVar6) {
          if (lVar4 < 1) goto LAB_001d84f7;
          ((child_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
LAB_001d80c1:
          uVar23 = 0x100;
LAB_001d8266:
          uVar16 = 1;
          goto LAB_001d8338;
        }
        if (lVar4 < 1) goto LAB_001d84f7;
        ((child_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
      }
    }
    else {
LAB_001d84b9:
      (((optimistic_lock *)parent_critical_section)->version).version.
      super___atomic_base<unsigned_long>._M_i = 0;
    }
  }
LAB_001d84c0:
  uVar16 = 0;
  uVar23 = 0;
LAB_001d8338:
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar23 | uVar16);
}

Assistant:

[[nodiscard]] std::optional<bool> olc_impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    olc_db<Key, Value>& db_instance,
    optimistic_lock::read_critical_section& parent_critical_section,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    in_critical_section<olc_node_ptr>** child_in_parent,
    optimistic_lock::read_critical_section* child_critical_section,
    node_type* child_type, olc_node_ptr* child) {
  const auto [child_i, found_child]{inode.find_child(key_byte)};

  if (found_child == nullptr) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  *child = found_child->load();

  if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check())) return {};

  auto& child_lock{node_ptr_lock(*child)};
  *child_critical_section = child_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(child_critical_section->must_restart())) return {};

  *child_type = child->type();

  if (*child_type != node_type::LEAF) {
    *child_in_parent = found_child;
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    return true;
  }

  const auto* const leaf{child->ptr<olc_leaf_type<Key, Value>*>()};
  if (!leaf->matches(k)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!child_critical_section->try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  const auto is_node_min_size{inode.is_min_size()};

  if (UNODB_DETAIL_LIKELY(!is_node_min_size)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const optimistic_lock::write_guard node_guard{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    child_guard.unlock_and_obsolete();

    inode.remove(child_i, db_instance);

    *child_in_parent = nullptr;
    return true;
  }

  UNODB_DETAIL_ASSERT(is_node_min_size);

  if constexpr (std::is_same_v<INode, olc_inode_4<Key, Value>>) {
    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    auto current_node{olc_art_policy<Key, Value>::make_db_inode_reclaimable_ptr(
        &inode, db_instance)};
    node_guard.unlock_and_obsolete();
    child_guard.unlock_and_obsolete();
    *node_in_parent = current_node->leave_last_child(child_i, db_instance);

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  } else {
    auto smaller_node{INode::smaller_derived_type::create(db_instance, inode)};

    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    smaller_node->init(db_instance, inode, node_guard, child_i, child_guard);
    *node_in_parent = detail::olc_node_ptr{smaller_node.release(),
                                           INode::smaller_derived_type::type};

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  }

#ifdef UNODB_DETAIL_WITH_STATS
  db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS

  return true;
}